

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

Sampler * vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::createRefSampler
                    (Sampler *__return_storage_ptr__,bool isFirst)

{
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,isFirst) == 0) {
    __return_storage_ptr__->wrapS = CLAMP_TO_EDGE;
    __return_storage_ptr__->wrapT = CLAMP_TO_EDGE;
    __return_storage_ptr__->wrapR = CLAMP_TO_EDGE;
    __return_storage_ptr__->minFilter = NEAREST;
    __return_storage_ptr__->magFilter = NEAREST;
    __return_storage_ptr__->lodThreshold = 0.0;
  }
  else {
    *(undefined1 **)__return_storage_ptr__ = &DAT_200000002;
    __return_storage_ptr__->wrapR = REPEAT_GL;
    __return_storage_ptr__->minFilter = LINEAR;
    __return_storage_ptr__->magFilter = LINEAR;
    __return_storage_ptr__->lodThreshold = 0.0;
  }
  __return_storage_ptr__->normalizedCoords = true;
  __return_storage_ptr__->depthStencilMode = MODE_DEPTH;
  __return_storage_ptr__->compare = COMPAREMODE_NONE;
  __return_storage_ptr__->compareChannel = 0;
  *(undefined8 *)&(__return_storage_ptr__->borderColor).v = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 9) = 0;
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler ImageSampleInstanceImages::createRefSampler (bool isFirst)
{
	if (isFirst)
	{
		// linear, wrapping
		return tcu::Sampler(tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR);
	}
	else
	{
		// nearest, clamping
		return tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST);
	}
}